

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::RandomBernoulliLikeLayerParams::ByteSizeLong
          (RandomBernoulliLikeLayerParams *this)

{
  int iVar1;
  int64 iVar2;
  float fVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  RandomBernoulliLikeLayerParams *this_local;
  
  sStack_18 = 0;
  iVar2 = seed(this);
  if (iVar2 != 0) {
    iVar2 = seed(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar2);
    sStack_18 = sStack_18 + 1;
  }
  fVar3 = prob(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sStack_18 = sStack_18 + 5;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t RandomBernoulliLikeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RandomBernoulliLikeLayerParams)
  size_t total_size = 0;

  // int64 seed = 1;
  if (this->seed() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->seed());
  }

  // float prob = 2;
  if (this->prob() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}